

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O0

int __thiscall ncnn::Dequantize::forward_inplace(Dequantize *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float *pfVar2;
  int *piVar3;
  Mat *in_RSI;
  long in_RDI;
  int i_6;
  float *ptr_4;
  int *intptr_4;
  int q_1;
  int i_5;
  float bias_2;
  float *ptr_3;
  int *intptr_3;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_1;
  float *ptr_2;
  int *intptr_2;
  int i_4;
  int j;
  float bias_1;
  float *ptr_1;
  int *intptr_1;
  int i_3;
  int h;
  int w_1;
  int i_2;
  int i_1;
  float bias;
  int i;
  float *ptr;
  int *intptr;
  int w;
  int dims;
  float *in_stack_fffffffffffffdd0;
  int iVar4;
  Mat *in_stack_fffffffffffffdd8;
  Mat *this_00;
  float local_214;
  float local_1f0;
  int local_1dc;
  Mat local_1d8;
  float *local_198;
  Mat local_190;
  int *local_150;
  int local_144;
  int local_140;
  float local_13c;
  Mat local_138;
  float *local_f8;
  Mat local_e0;
  int *local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  float *local_80;
  int *local_78;
  int local_6c;
  int local_68;
  float local_64;
  float *local_60;
  int *local_58;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  float local_38;
  int local_34;
  float *local_30;
  int *local_28;
  int local_20;
  int local_1c;
  Mat *local_10;
  
  local_1c = in_RSI->dims;
  local_10 = in_RSI;
  if (local_1c == 1) {
    local_20 = in_RSI->w;
    local_28 = Mat::operator_cast_to_int_(in_RSI);
    local_30 = Mat::operator_cast_to_float_(local_10);
    if (*(int *)(in_RDI + 0x84) == 0) {
      for (local_40 = 0; local_40 < local_20; local_40 = local_40 + 1) {
        local_30[local_40] = (float)local_28[local_40] * *(float *)(in_RDI + 0x80);
      }
    }
    else if (*(int *)(in_RDI + 0x88) < 2) {
      pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x90),0);
      local_38 = *pfVar2;
      for (local_3c = 0; local_3c < local_20; local_3c = local_3c + 1) {
        local_30[local_3c] = (float)local_28[local_3c] * *(float *)(in_RDI + 0x80) + local_38;
      }
    }
    else {
      for (local_34 = 0; local_34 < local_20; local_34 = local_34 + 1) {
        iVar4 = local_28[local_34];
        fVar1 = *(float *)(in_RDI + 0x80);
        pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x90),local_34);
        local_30[local_34] = (float)iVar4 * fVar1 + *pfVar2;
      }
    }
  }
  if (local_1c == 2) {
    local_44 = local_10->w;
    local_48 = local_10->h;
    if (*(int *)(in_RDI + 0x84) == 0) {
      for (local_6c = 0; local_6c < local_48; local_6c = local_6c + 1) {
        local_78 = Mat::row<int_const>(local_10,local_6c);
        local_80 = Mat::row(local_10,local_6c);
        for (local_84 = 0; local_84 < local_44; local_84 = local_84 + 1) {
          local_80[local_84] = (float)local_78[local_84] * *(float *)(in_RDI + 0x80);
        }
      }
    }
    else {
      for (local_4c = 0; local_4c < local_48; local_4c = local_4c + 1) {
        local_58 = Mat::row<int_const>(local_10,local_4c);
        local_60 = Mat::row(local_10,local_4c);
        if (*(int *)(in_RDI + 0x88) < 2) {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x90),0);
          local_1f0 = *pfVar2;
        }
        else {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x90),local_4c);
          local_1f0 = *pfVar2;
        }
        local_64 = local_1f0;
        for (local_68 = 0; local_68 < local_44; local_68 = local_68 + 1) {
          local_60[local_68] = (float)local_58[local_68] * *(float *)(in_RDI + 0x80) + local_1f0;
        }
      }
    }
  }
  if (local_1c == 3) {
    local_88 = local_10->w;
    local_8c = local_10->h;
    local_90 = local_10->c;
    local_94 = local_88 * local_8c;
    if (*(int *)(in_RDI + 0x84) == 0) {
      for (local_144 = 0; iVar4 = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
          local_144 < local_90; local_144 = local_144 + 1) {
        this_00 = &local_190;
        Mat::channel(this_00,iVar4);
        piVar3 = Mat::operator_cast_to_int_(this_00);
        Mat::~Mat((Mat *)0x1b0510);
        local_150 = piVar3;
        Mat::channel(this_00,iVar4);
        in_stack_fffffffffffffdd0 = Mat::operator_cast_to_float_(&local_1d8);
        Mat::~Mat((Mat *)0x1b0554);
        for (local_1dc = 0; local_1dc < local_94; local_1dc = local_1dc + 1) {
          in_stack_fffffffffffffdd0[local_1dc] =
               (float)local_150[local_1dc] * *(float *)(in_RDI + 0x80);
        }
        local_198 = in_stack_fffffffffffffdd0;
      }
    }
    else {
      for (local_98 = 0; local_98 < local_90; local_98 = local_98 + 1) {
        Mat::channel(in_stack_fffffffffffffdd8,(int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
        piVar3 = Mat::operator_cast_to_int_(&local_e0);
        Mat::~Mat((Mat *)0x1b0320);
        local_a0 = piVar3;
        Mat::channel(in_stack_fffffffffffffdd8,(int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_138);
        Mat::~Mat((Mat *)0x1b036c);
        local_f8 = pfVar2;
        if (*(int *)(in_RDI + 0x88) < 2) {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x90),0);
          local_214 = *pfVar2;
        }
        else {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x90),local_98);
          local_214 = *pfVar2;
        }
        local_13c = local_214;
        for (local_140 = 0; local_140 < local_94; local_140 = local_140 + 1) {
          local_f8[local_140] = (float)local_a0[local_140] * *(float *)(in_RDI + 0x80) + local_214;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Dequantize::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        const int* intptr = bottom_top_blob;
        float* ptr = bottom_top_blob;

        if (bias_term)
        {
            if (bias_data_size > 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias_data[i];
                }
            }
            else
            {
                float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                ptr[i] = intptr[i] * scale;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_top_blob.row<const int>(i);
                float* ptr = bottom_top_blob.row(i);

                float bias = bias_data_size > 1 ? bias_data[i] : bias_data[0];

                for (int j=0; j<w; j++)
                {
                    ptr[j] = intptr[j] * scale + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_top_blob.row<const int>(i);
                float* ptr = bottom_top_blob.row(i);

                for (int j=0; j<w; j++)
                {
                    ptr[j] = intptr[j] * scale;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_top_blob.channel(q);
                float* ptr = bottom_top_blob.channel(q);

                float bias = bias_data_size > 1 ? bias_data[q] : bias_data[0];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_top_blob.channel(q);
                float* ptr = bottom_top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
        }
    }

    return 0;
}